

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

string * get_date_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  time_t now;
  tm tm;
  char time [1000];
  long local_440;
  tm local_438;
  char local_3f8 [1000];
  
  local_440 = std::chrono::_V2::system_clock::now();
  local_440 = local_440 / 1000000000;
  ptVar1 = gmtime(&local_440);
  local_438.tm_sec = ptVar1->tm_sec;
  local_438.tm_min = ptVar1->tm_min;
  local_438.tm_hour = ptVar1->tm_hour;
  local_438.tm_mday = ptVar1->tm_mday;
  local_438.tm_mon = ptVar1->tm_mon;
  local_438.tm_year = ptVar1->tm_year;
  local_438.tm_wday = ptVar1->tm_wday;
  local_438.tm_yday = ptVar1->tm_yday;
  local_438.tm_isdst = ptVar1->tm_isdst;
  local_438._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_438.tm_gmtoff = ptVar1->tm_gmtoff;
  local_438.tm_zone = ptVar1->tm_zone;
  strftime(local_3f8,1000,"%a, %d %b %Y %H:%M:%S %Z",&local_438);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  strlen(local_3f8);
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

std::string get_date() {
    char time[1000];
    time_t now = std::chrono::system_clock::to_time_t(std::chrono::system_clock::now());
    struct tm tm = *gmtime(&now);
    strftime(time, sizeof time, "%a, %d %b %Y %H:%M:%S %Z", &tm);

    return std::string(time);
}